

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

Error * ot::commissioner::Interpreter::GetJoinerType
                  (Error *__return_storage_ptr__,JoinerType *aType,string *aStr)

{
  bool bVar1;
  char *begin;
  char *pcVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  pointer local_a8;
  char *pcStack_a0;
  size_t local_98;
  undefined8 local_90;
  type *local_88;
  code *local_80;
  string local_70;
  undefined1 local_50 [40];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_a8,"meshcop",(allocator *)local_50);
  bVar1 = CaseInsensitiveEqual(aStr,(string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  if (bVar1) {
    *aType = kMeshCoP;
  }
  else {
    std::__cxx11::string::string((string *)&local_a8,"ae",(allocator *)local_50);
    bVar1 = CaseInsensitiveEqual(aStr,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    if (bVar1) {
      *aType = kAE;
    }
    else {
      std::__cxx11::string::string((string *)&local_a8,"nmkp",(allocator *)local_50);
      bVar1 = CaseInsensitiveEqual(aStr,(string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      if (bVar1) {
        *aType = kNMKP;
      }
      else {
        local_a8 = (pointer)CONCAT44(local_a8._4_4_,0xd);
        pcStack_a0 = "{} is not a valid joiner type";
        local_98 = 0x1d;
        local_90 = 0x100000000;
        local_80 = ::fmt::v10::detail::
                   parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
        ;
        pcVar2 = "{} is not a valid joiner type";
        local_88 = (type *)&local_a8;
        while (begin = pcVar2, begin != "") {
          pcVar2 = begin + 1;
          if (*begin == '}') {
            if ((pcVar2 == "") || (*pcVar2 != '}')) {
              ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
            }
            pcVar2 = begin + 2;
          }
          else if (*begin == '{') {
            pcVar2 = ::fmt::v10::detail::
                     parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                               (begin,"",(format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_a8);
          }
        }
        local_a8 = (aStr->_M_dataplus)._M_p;
        pcStack_a0 = (char *)aStr->_M_string_length;
        fmt.size_ = 0xd;
        fmt.data_ = (char *)0x1d;
        args.field_1.args_ = in_R9.args_;
        args.desc_ = (unsigned_long_long)&local_a8;
        ::fmt::v10::vformat_abi_cxx11_(&local_70,(v10 *)"{} is not a valid joiner type",fmt,args);
        local_50._0_4_ = kInvalidArgs;
        std::__cxx11::string::string((string *)(local_50 + 8),(string *)&local_70);
        Error::operator=(__return_storage_ptr__,(Error *)local_50);
        std::__cxx11::string::~string((string *)(local_50 + 8));
        std::__cxx11::string::~string((string *)&local_70);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Error Interpreter::GetJoinerType(JoinerType &aType, const std::string &aStr)
{
    Error error;

    if (CaseInsensitiveEqual(aStr, "meshcop"))
    {
        aType = JoinerType::kMeshCoP;
    }
    else if (CaseInsensitiveEqual(aStr, "ae"))
    {
        aType = JoinerType::kAE;
    }
    else if (CaseInsensitiveEqual(aStr, "nmkp"))
    {
        aType = JoinerType::kNMKP;
    }
    else
    {
        error = ERROR_INVALID_ARGS("{} is not a valid joiner type", aStr);
    }

    return error;
}